

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_trace_file.c
# Opt level: O0

mFILE * find_file_dir(char *file,char *dirname)

{
  int iVar1;
  ulong __n;
  size_t sVar2;
  char *pcVar3;
  char *local_1068;
  ulong local_1058;
  long l;
  char *endp;
  char *path_end;
  char *cp;
  size_t len;
  char path [4097];
  char *dirname_local;
  char *file_local;
  
  unique0x10000238 = dirname;
  cp = (char *)strlen(dirname);
  if (stack0xffffffffffffffe0[(long)(cp + -1)] == '/') {
    cp = cp + -1;
  }
  if ((*file == '/') || ((cp == (char *)0x1 && (*stack0xffffffffffffffe0 == '.')))) {
    sprintf((char *)&len,"%s",file);
  }
  else {
    endp = (char *)&len;
    len._0_1_ = 0;
    dirname_local = file;
    while (path_end = strchr(stack0xffffffffffffffe0,0x25), path_end != (char *)0x0) {
      __n = strtol(path_end + 1,(char **)&l,10);
      if (*(char *)l == 's') {
        strncpy(endp,stack0xffffffffffffffe0,(long)path_end - (long)stack0xffffffffffffffe0);
        endp = endp + ((long)path_end - (long)stack0xffffffffffffffe0);
        if (__n == 0) {
          strcpy(endp,dirname_local);
          sVar2 = strlen(dirname_local);
          endp = endp + sVar2;
          __n = strlen(dirname_local);
        }
        else {
          strncpy(endp,dirname_local,__n);
          sVar2 = strlen(dirname_local);
          local_1058 = __n;
          if (sVar2 < __n) {
            local_1058 = strlen(dirname_local);
          }
          endp = endp + local_1058;
          sVar2 = strlen(dirname_local);
          if (sVar2 < __n) {
            __n = strlen(dirname_local);
          }
        }
        dirname_local = dirname_local + __n;
        cp = cp + -((l + 1) - (long)stack0xffffffffffffffe0);
        register0x00000000 = (char *)(l + 1);
      }
      else {
        strncpy(endp,stack0xffffffffffffffe0,(l + 1) - (long)stack0xffffffffffffffe0);
        endp = endp + ((l + 1) - (long)stack0xffffffffffffffe0);
        register0x00000000 = (char *)(l + 1);
      }
    }
    strncpy(endp,stack0xffffffffffffffe0,(size_t)cp);
    pcVar3 = (char *)strlen(stack0xffffffffffffffe0);
    if (pcVar3 < cp) {
      local_1068 = (char *)strlen(stack0xffffffffffffffe0);
    }
    else {
      local_1068 = cp;
    }
    local_1068 = local_1068 + (long)endp;
    *local_1068 = '\0';
    endp = local_1068;
    if (*dirname_local != '\0') {
      endp = local_1068 + 1;
      *local_1068 = '/';
      strcpy(endp,dirname_local);
    }
  }
  iVar1 = is_file((char *)&len);
  if (iVar1 == 0) {
    file_local = (char *)0x0;
  }
  else {
    file_local = (char *)mfopen((char *)&len,"rb");
  }
  return (mFILE *)file_local;
}

Assistant:

static mFILE *find_file_dir(char *file, char *dirname) {
    char path[PATH_MAX+1];
    size_t len = strlen(dirname);
    char *cp;

    if (dirname[len-1] == '/')
	len--;

    /* Special case for "./" or absolute filenames */
    if (*file == '/' || (len==1 && *dirname == '.')) {
	sprintf(path, "%s", file);
    } else {
	/* Handle %[0-9]*s expansions, if required */
	char *path_end = path;
	*path = 0;
	while ((cp = strchr(dirname, '%'))) {
	    char *endp;
	    long l = strtol(cp+1, &endp, 10);
	    if (*endp != 's') {
		strncpy(path_end, dirname, (endp+1)-dirname);
		path_end += (endp+1)-dirname;
		dirname = endp+1;
		continue;
	    }
	    
	    strncpy(path_end, dirname, cp-dirname);
	    path_end += cp-dirname;
	    if (l) {
		strncpy(path_end, file, l);
		path_end += MIN(strlen(file), l);
		file     += MIN(strlen(file), l);
	    } else {
		strcpy(path_end, file);
		path_end += strlen(file);
		file     += strlen(file);
	    }
	    len -= (endp+1) - dirname;
	    dirname = endp+1;
	}
	strncpy(path_end, dirname, len);
	path_end += MIN(strlen(dirname), len);
	*path_end = 0;
	if (*file) {
	    *path_end++ = '/';
	    strcpy(path_end, file);
	}

	//fprintf(stderr, "*PATH=\"%s\"\n", path);
    }

    if (is_file(path)) {
	return mfopen(path, "rb");
    }

    return NULL;
}